

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O1

void allocateRandomTape(randomTape_t *tape,picnic_instance_t *params)

{
  byte bVar1;
  uint8_t *puVar2;
  ulong uVar3;
  ulong __size;
  ulong __nmemb;
  
  bVar1 = params->view_size;
  puVar2 = (uint8_t *)calloc(1,(ulong)bVar1);
  tape->aux_bits = puVar2;
  __size = (ulong)((uint)bVar1 * 2);
  puVar2 = (uint8_t *)calloc(1,__size);
  tape->parity_tapes = puVar2;
  __nmemb = (ulong)params->num_MPC_parties;
  puVar2 = (uint8_t *)calloc(__nmemb,__size);
  if (__nmemb != 0) {
    uVar3 = 0;
    do {
      tape->tape[uVar3] = puVar2;
      puVar2 = puVar2 + __size;
      uVar3 = uVar3 + 1;
    } while (__nmemb != uVar3);
  }
  tape->pos = 0;
  tape->aux_pos = 0;
  return;
}

Assistant:

void allocateRandomTape(randomTape_t* tape, const picnic_instance_t* params) {
  tape->aux_bits       = calloc(1, params->view_size);
  size_t tapeSizeBytes = 2 * params->view_size;
  tape->parity_tapes   = calloc(1, tapeSizeBytes);
  uint8_t* slab        = calloc(params->num_MPC_parties, tapeSizeBytes);
  for (uint8_t i = 0; i < params->num_MPC_parties; i++) {
    tape->tape[i] = slab;
    slab += tapeSizeBytes;
  }
  tape->pos     = 0;
  tape->aux_pos = 0;
}